

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern.h
# Opt level: O0

void __thiscall
lf::refinement::Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
          (Hybrid2DRefinementPattern *this,RefEl ref_el,RefPat ref_pat,sub_idx_t anchor)

{
  uint uVar1;
  size_type sVar2;
  ostream *poVar3;
  runtime_error *this_00;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [399];
  RefElType local_21;
  uint local_20;
  RefPat local_1c;
  sub_idx_t anchor_local;
  RefPat ref_pat_local;
  Hybrid2DRefinementPattern *this_local;
  RefEl ref_el_local;
  
  local_21 = ref_el.type_;
  local_20 = anchor;
  local_1c = ref_pat;
  _anchor_local = this;
  this_local._7_1_ = ref_el.type_;
  lf::geometry::RefinementPattern::RefinementPattern(&this->super_RefinementPattern,ref_el);
  uVar1 = local_20;
  (this->super_RefinementPattern)._vptr_RefinementPattern = (_func_int **)&PTR_NumChildren_00be4728;
  this->anchor_ = local_20;
  this->ref_pat_ = local_1c;
  this->anchor_set_ = local_20 != 0xffffffff;
  if (((this->anchor_set_ & 1U) != 0) &&
     (sVar2 = lf::base::RefEl::NumSubEntities(&(this->super_RefinementPattern).ref_el_,1),
     sVar2 <= uVar1)) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar3 = std::operator<<(local_1b0,"Anchor ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    poVar3 = std::operator<<(poVar3," invalid for ");
    lf::base::RefEl::ToString_abi_cxx11_(&local_1e0,&(this->super_RefinementPattern).ref_el_);
    std::operator<<(poVar3,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"anchor < ref_el_.NumSubEntities(1)",&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.h"
               ,&local_229);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_200,&local_228,0x5e,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Hybrid2DRefinementPattern(lf::base::RefEl ref_el, RefPat ref_pat,
                            lf::base::sub_idx_t anchor)
      : geometry::RefinementPattern(ref_el),
        anchor_(anchor),
        ref_pat_(ref_pat),
        anchor_set_(anchor != idx_nil) {
    if (anchor_set_) {
      LF_VERIFY_MSG(
          anchor < ref_el_.NumSubEntities(1),
          "Anchor " << anchor << " invalid for " << ref_el_.ToString());
    }
  }